

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

void __thiscall miniscript::Node<XOnlyPubKey>::~Node(Node<XOnlyPubKey> *this)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer puVar4;
  pointer pXVar5;
  pointer psVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar6 = (this->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->subs).
      super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == psVar6) {
LAB_00199e00:
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::~vector(&this->subs);
    puVar4 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4,(long)(this->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4
                     );
    }
    pXVar5 = (this->keys).super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pXVar5 == (pointer)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      operator_delete(pXVar5,(long)(this->keys).
                                   super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pXVar5)
      ;
      return;
    }
    __stack_chk_fail();
  }
LAB_00199d9c:
  peVar2 = psVar6[-1].
           super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = psVar6[-1].
            super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  psVar6[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  psVar6[-1].super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->subs).
  super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar6 + -1;
  do {
    psVar6 = (peVar2->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if ((peVar2->subs).
          super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == psVar6) {
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar6 = (this->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->subs).
            super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == psVar6) goto LAB_00199e00;
        goto LAB_00199d9c;
      }
      std::
      vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
      ::emplace_back<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>
                ((vector<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<XOnlyPubKey>const>>>
                  *)&this->subs,psVar6 + -1);
      psVar3 = (peVar2->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar6 = psVar3 + -1;
      (peVar2->subs).
      super__Vector_base<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar6;
      this_01 = psVar3[-1].
                super___shared_ptr<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    } while (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  } while( true );
}

Assistant:

~Node() {
        while (!subs.empty()) {
            auto node = std::move(subs.back());
            subs.pop_back();
            while (!node->subs.empty()) {
                subs.push_back(std::move(node->subs.back()));
                node->subs.pop_back();
            }
        }
    }